

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

void __thiscall libcellml::Model::clean(Model *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  element_type *peVar5;
  size_t sVar6;
  string local_98;
  byte local_71;
  string local_70;
  UnitsPtr u;
  size_t i_1;
  ComponentEntity local_28;
  size_t local_18;
  size_t i;
  Model *this_local;
  
  i = (size_t)this;
  local_18 = ComponentEntity::componentCount(&this->super_ComponentEntity);
  while (local_18 = local_18 - 1, local_18 != 0xffffffffffffffff) {
    ComponentEntity::component(&local_28,(size_t)this);
    bVar2 = traverseHierarchyAndRemoveIfEmpty((ComponentPtr *)&local_28);
    std::shared_ptr<libcellml::Component>::~shared_ptr
              ((shared_ptr<libcellml::Component> *)&local_28);
    if (bVar2) {
      ComponentEntity::removeComponent(&this->super_ComponentEntity,local_18);
    }
  }
  u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unitsCount(this);
  while (u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              ((long)&u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      ._M_pi[-1]._M_weak_count + 3),
        u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xffffffffffffffff) {
    units((Model *)&stack0xffffffffffffffb0,(size_t)this);
    peVar5 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&stack0xffffffffffffffb0);
    local_71 = 0;
    bVar1 = false;
    bVar3 = ImportedEntity::isImport(&peVar5->super_ImportedEntity);
    bVar2 = false;
    if (!bVar3) {
      peVar5 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&stack0xffffffffffffffb0);
      NamedEntity::name_abi_cxx11_(&local_70,&peVar5->super_NamedEntity);
      local_71 = 1;
      uVar4 = std::__cxx11::string::empty();
      bVar2 = false;
      if ((uVar4 & 1) != 0) {
        peVar5 = std::
                 __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&stack0xffffffffffffffb0);
        Entity::id_abi_cxx11_(&local_98,(Entity *)peVar5);
        bVar1 = true;
        uVar4 = std::__cxx11::string::empty();
        bVar2 = false;
        if ((uVar4 & 1) != 0) {
          peVar5 = std::
                   __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&stack0xffffffffffffffb0);
          sVar6 = Units::unitCount(peVar5);
          bVar2 = sVar6 == 0;
        }
      }
    }
    if (bVar1) {
      std::__cxx11::string::~string((string *)&local_98);
    }
    if ((local_71 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_70);
    }
    if (bVar2) {
      removeUnits(this,(size_t)u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
    }
    std::shared_ptr<libcellml::Units>::~shared_ptr
              ((shared_ptr<libcellml::Units> *)&stack0xffffffffffffffb0);
  }
  return;
}

Assistant:

void Model::clean()
{
    // Remove empty components.
    for (size_t i = componentCount() - 1; i != MAX_SIZE_T; --i) {
        if (traverseHierarchyAndRemoveIfEmpty(component(i))) {
            removeComponent(i);
        }
    }

    // Remove empty units.
    for (size_t i = unitsCount() - 1; i != MAX_SIZE_T; --i) {
        auto u = units(i);
        if (!u->isImport()
            && u->name().empty()
            && u->id().empty()
            && (u->unitCount() == 0)) {
            removeUnits(i);
        }
    }
}